

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MemberAccessExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MemberAccessExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  MemberAccessExpressionSyntax *pMVar11;
  
  pMVar11 = (MemberAccessExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MemberAccessExpressionSyntax *)this->endPtr < pMVar11 + 1) {
    pMVar11 = (MemberAccessExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pMVar11 + 1);
  }
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar7 = args_2->kind;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pMVar11->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar11->super_ExpressionSyntax).super_SyntaxNode.kind = MemberAccessExpression;
  (pMVar11->left).ptr = args;
  (pMVar11->dot).kind = TVar3;
  (pMVar11->dot).field_0x2 = uVar4;
  (pMVar11->dot).numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar11->dot).rawLen = uVar6;
  (pMVar11->dot).info = pIVar1;
  (pMVar11->name).kind = TVar7;
  (pMVar11->name).field_0x2 = uVar8;
  (pMVar11->name).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar11->name).rawLen = uVar10;
  (pMVar11->name).info = pIVar2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pMVar11;
  return pMVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }